

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

AssertionResult
testing::internal::CmpHelperSTRNE(char *s1_expression,char *s2_expression,wchar_t *s1,wchar_t *s2)

{
  int iVar1;
  AssertionResult *pAVar2;
  wchar_t *in_RCX;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX;
  wchar_t **value;
  wchar_t **value_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_00;
  AssertionResult *in_RDI;
  wchar_t *in_R8;
  long in_FS_OFFSET;
  bool bVar3;
  AssertionResult AVar4;
  AssertionResult local_90;
  testing local_80 [8];
  testing local_78 [8];
  char *local_70;
  char *local_68;
  string local_60;
  string local_40;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  bVar3 = in_R8 == (wchar_t *)0x0;
  if (in_RCX == (wchar_t *)0x0) {
LAB_00149c2e:
    if (bVar3) {
      local_90.success_ = false;
      local_90.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      pAVar2 = AssertionResult::operator<<(&local_90,(char (*) [12])"Expected: (");
      pAVar2 = AssertionResult::operator<<(pAVar2,&local_68);
      pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [7])") != (");
      pAVar2 = AssertionResult::operator<<(pAVar2,&local_70);
      pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [12])"), actual: ");
      PrintToString<wchar_t_const*>(&local_40,local_78,value);
      pAVar2 = AssertionResult::operator<<(pAVar2,&local_40);
      pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [5])" vs ");
      PrintToString<wchar_t_const*>(&local_60,local_80,value_00);
      pAVar2 = AssertionResult::operator<<(pAVar2,&local_60);
      AssertionResult::AssertionResult(in_RDI,pAVar2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p != &local_40.field_2) {
        operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
      }
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_90.message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      in_RDX.ptr_ = extraout_RDX_00;
      goto LAB_00149d35;
    }
  }
  else if (in_R8 != (wchar_t *)0x0) {
    iVar1 = wcscmp(in_RCX,in_R8);
    bVar3 = iVar1 == 0;
    in_RDX.ptr_ = extraout_RDX;
    goto LAB_00149c2e;
  }
  in_RDI->success_ = true;
  (in_RDI->message_).ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
LAB_00149d35:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    AVar4.message_.ptr_ = in_RDX.ptr_;
    AVar4._0_8_ = in_RDI;
    return AVar4;
  }
  __stack_chk_fail();
}

Assistant:

AssertionResult CmpHelperSTRNE(const char* s1_expression,
                               const char* s2_expression,
                               const wchar_t* s1,
                               const wchar_t* s2) {
  if (!String::WideCStringEquals(s1, s2)) {
    return AssertionSuccess();
  }

  return AssertionFailure() << "Expected: (" << s1_expression << ") != ("
                            << s2_expression << "), actual: "
                            << PrintToString(s1)
                            << " vs " << PrintToString(s2);
}